

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

void wallet::coinselector_tests::SelectCoins_effective_value_test_invoker(void)

{
  basic_wrap_stringstream<char> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long in_FS_OFFSET;
  basic_wrap_stringstream<char> *in_stack_ffffffffffffece8;
  std_string *in_stack_ffffffffffffecf0;
  basic_wrap_stringstream<char> *in_stack_ffffffffffffecf8;
  const_string *in_stack_ffffffffffffed10;
  size_t in_stack_ffffffffffffed18;
  undefined1 *__s;
  const_string *in_stack_ffffffffffffed20;
  const_string *file;
  unit_test_log_t *in_stack_ffffffffffffed28;
  undefined1 local_1140 [320];
  undefined8 local_1000;
  undefined1 local_fa8 [408];
  undefined1 local_e10 [408];
  undefined1 local_c78 [408];
  SelectCoins_effective_value_test t;
  undefined1 local_1a0 [408];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,
             (pointer)in_stack_ffffffffffffecf0,(unsigned_long)in_stack_ffffffffffffece8);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffece8);
  boost::operator<<(in_stack_ffffffffffffecf8,(char *)in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [33])in_stack_ffffffffffffecf0);
  pbVar1 = boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [15])in_stack_ffffffffffffecf0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecf8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
             in_stack_ffffffffffffed10);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffece8);
  SelectCoins_effective_value_test::SelectCoins_effective_value_test
            ((SelectCoins_effective_value_test *)in_stack_ffffffffffffece8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,
             (pointer)in_stack_ffffffffffffecf0,(unsigned_long)in_stack_ffffffffffffece8);
  memset(local_c78,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffece8);
  boost::operator<<(in_stack_ffffffffffffecf8,(char *)in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [33])in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [16])in_stack_ffffffffffffecf0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecf8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
             in_stack_ffffffffffffed10);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::unit_test::setup_conditional<wallet::coinselector_tests::SelectCoins_effective_value_test>
            ((SelectCoins_effective_value_test *)0xd7559f);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,
             (pointer)in_stack_ffffffffffffecf0,(unsigned_long)in_stack_ffffffffffffece8);
  memset(local_e10,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffece8);
  boost::operator<<(in_stack_ffffffffffffecf8,(char *)in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [33])in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [13])in_stack_ffffffffffffecf0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecf8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
             in_stack_ffffffffffffed10);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffece8);
  SelectCoins_effective_value_test::test_method((SelectCoins_effective_value_test *)pbVar1);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,
             (pointer)in_stack_ffffffffffffecf0,(unsigned_long)in_stack_ffffffffffffece8);
  memset(local_fa8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffece8);
  boost::operator<<(in_stack_ffffffffffffecf8,(char *)in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [33])in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [19])in_stack_ffffffffffffecf0);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecf8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
             in_stack_ffffffffffffed10);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::unit_test::
  teardown_conditional<wallet::coinselector_tests::SelectCoins_effective_value_test>
            ((SelectCoins_effective_value_test *)0xd757cb);
  file = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,
             (pointer)in_stack_ffffffffffffecf0,(unsigned_long)in_stack_ffffffffffffece8);
  __s = local_1140;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffece8);
  pbVar1 = boost::operator<<(in_stack_ffffffffffffecf8,(char *)in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [33])in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [15])in_stack_ffffffffffffecf0);
  this_00 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecf8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this_00,in_stack_ffffffffffffecf0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,file,(size_t)__s,(const_string *)pbVar1);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffece8);
  SelectCoins_effective_value_test::~SelectCoins_effective_value_test
            ((SelectCoins_effective_value_test *)in_stack_ffffffffffffece8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(SelectCoins_effective_value_test)
{
    // Test that the effective value is used to check whether preset inputs provide sufficient funds when subtract_fee_outputs is not used.
    // This test creates a coin whose value is higher than the target but whose effective value is lower than the target.
    // The coin is selected using coin control, with m_allow_other_inputs = false. SelectCoins should fail due to insufficient funds.

    std::unique_ptr<CWallet> wallet = NewWallet(m_node);

    CoinsResult available_coins;
    {
        std::unique_ptr<CWallet> dummyWallet = NewWallet(m_node, /*wallet_name=*/"dummy");
        add_coin(available_coins, *dummyWallet, 100000); // 0.001 BTC
    }

    CAmount target{99900}; // 0.000999 BTC

    FastRandomContext rand;
    CoinSelectionParams cs_params{
        rand,
        /*change_output_size=*/34,
        /*change_spend_size=*/148,
        /*min_change_target=*/1000,
        /*effective_feerate=*/CFeeRate(3000),
        /*long_term_feerate=*/CFeeRate(1000),
        /*discard_feerate=*/CFeeRate(1000),
        /*tx_noinputs_size=*/0,
        /*avoid_partial=*/false,
    };
    CCoinControl cc;
    cc.m_allow_other_inputs = false;
    COutput output = available_coins.All().at(0);
    cc.SetInputWeight(output.outpoint, 148);
    cc.Select(output.outpoint).SetTxOut(output.txout);

    LOCK(wallet->cs_wallet);
    const auto preset_inputs = *Assert(FetchSelectedInputs(*wallet, cc, cs_params));
    available_coins.Erase({available_coins.coins[OutputType::BECH32].begin()->outpoint});

    const auto result = SelectCoins(*wallet, available_coins, preset_inputs, target, cc, cs_params);
    BOOST_CHECK(!result);
}